

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O0

int __thiscall jpgd::jpeg_decoder::next_marker(jpeg_decoder *this)

{
  uint uVar1;
  uint bytes;
  uint c;
  jpeg_decoder *this_local;
  
  do {
    do {
      uVar1 = get_bits(this,8);
    } while (uVar1 != 0xff);
    do {
      uVar1 = get_bits(this,8);
    } while (uVar1 == 0xff);
  } while (uVar1 == 0);
  return uVar1;
}

Assistant:

int jpeg_decoder::next_marker()
	{
		uint c, bytes;

		bytes = 0;

		do
		{
			do
			{
				bytes++;
				c = get_bits(8);
			} while (c != 0xFF);

			do
			{
				c = get_bits(8);
			} while (c == 0xFF);

		} while (c == 0);

		// If bytes > 0 here, there where extra bytes before the marker (not good).

		return c;
	}